

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_spbcgs.c
# Opt level: O0

SUNErrCode SUNLinSolFree_SPBCGS(SUNLinearSolver S)

{
  long *in_RDI;
  
  if (*in_RDI != 0) {
    if (*(long *)(*in_RDI + 0x60) != 0) {
      N_VDestroy(*(undefined8 *)(*in_RDI + 0x60));
      *(undefined8 *)(*in_RDI + 0x60) = 0;
    }
    if (*(long *)(*in_RDI + 0x58) != 0) {
      N_VDestroy(*(undefined8 *)(*in_RDI + 0x58));
      *(undefined8 *)(*in_RDI + 0x58) = 0;
    }
    if (*(long *)(*in_RDI + 0x68) != 0) {
      N_VDestroy(*(undefined8 *)(*in_RDI + 0x68));
      *(undefined8 *)(*in_RDI + 0x68) = 0;
    }
    if (*(long *)(*in_RDI + 0x70) != 0) {
      N_VDestroy(*(undefined8 *)(*in_RDI + 0x70));
      *(undefined8 *)(*in_RDI + 0x70) = 0;
    }
    if (*(long *)(*in_RDI + 0x78) != 0) {
      N_VDestroy(*(undefined8 *)(*in_RDI + 0x78));
      *(undefined8 *)(*in_RDI + 0x78) = 0;
    }
    if (*(long *)(*in_RDI + 0x80) != 0) {
      N_VDestroy(*(undefined8 *)(*in_RDI + 0x80));
      *(undefined8 *)(*in_RDI + 0x80) = 0;
    }
    if (*(long *)(*in_RDI + 0x88) != 0) {
      N_VDestroy(*(undefined8 *)(*in_RDI + 0x88));
      *(undefined8 *)(*in_RDI + 0x88) = 0;
    }
    free((void *)*in_RDI);
    *in_RDI = 0;
  }
  if (in_RDI[1] != 0) {
    free((void *)in_RDI[1]);
    in_RDI[1] = 0;
  }
  free(in_RDI);
  return 0;
}

Assistant:

SUNErrCode SUNLinSolFree_SPBCGS(SUNLinearSolver S)
{
  if (S->content)
  {
    /* delete items from within the content structure */
    if (SPBCGS_CONTENT(S)->r_star)
    {
      N_VDestroy(SPBCGS_CONTENT(S)->r_star);
      SPBCGS_CONTENT(S)->r_star = NULL;
    }
    if (SPBCGS_CONTENT(S)->r)
    {
      N_VDestroy(SPBCGS_CONTENT(S)->r);
      SPBCGS_CONTENT(S)->r = NULL;
    }
    if (SPBCGS_CONTENT(S)->p)
    {
      N_VDestroy(SPBCGS_CONTENT(S)->p);
      SPBCGS_CONTENT(S)->p = NULL;
    }
    if (SPBCGS_CONTENT(S)->q)
    {
      N_VDestroy(SPBCGS_CONTENT(S)->q);
      SPBCGS_CONTENT(S)->q = NULL;
    }
    if (SPBCGS_CONTENT(S)->u)
    {
      N_VDestroy(SPBCGS_CONTENT(S)->u);
      SPBCGS_CONTENT(S)->u = NULL;
    }
    if (SPBCGS_CONTENT(S)->Ap)
    {
      N_VDestroy(SPBCGS_CONTENT(S)->Ap);
      SPBCGS_CONTENT(S)->Ap = NULL;
    }
    if (SPBCGS_CONTENT(S)->vtemp)
    {
      N_VDestroy(SPBCGS_CONTENT(S)->vtemp);
      SPBCGS_CONTENT(S)->vtemp = NULL;
    }
    free(S->content);
    S->content = NULL;
  }
  if (S->ops)
  {
    free(S->ops);
    S->ops = NULL;
  }
  free(S);
  S = NULL;
  return SUN_SUCCESS;
}